

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O3

void TPZShapeHDivConstant<pzshape::TPZShapeTetra>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  int d_1;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int d_2;
  ulong uVar9;
  long lVar10;
  int d;
  long lVar11;
  long lVar12;
  TPZVec<double> div;
  TPZFNMatrix<12,_double> vecDiv;
  ulong local_2b0;
  ulong local_2a8;
  long local_290;
  long local_270;
  TPZVec<double> local_268;
  TPZFMatrix<double> local_248;
  TPZFMatrix<double> local_1b8;
  double local_128 [13];
  TPZFMatrix<double> local_c0;
  
  local_1b8.fElem = local_128;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018874b0;
  local_1b8.fSize = 0xc;
  local_1b8.fGiven = local_1b8.fElem;
  TPZVec<int>::TPZVec(&local_1b8.fPivot.super_TPZVec<int>,0);
  local_1b8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1b8.fPivot.super_TPZVec<int>.fStore = local_1b8.fPivot.fExtAlloc;
  local_1b8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1b8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1b8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1b8.fWork.fStore = (double *)0x0;
  local_1b8.fWork.fNElements = 0;
  local_1b8.fWork.fNAlloc = 0;
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018871c0;
  TPZVec<double>::TPZVec(&local_268,4);
  memset(local_1b8.fElem,0,
         local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZVec<double>::Fill(&local_268,(double *)&local_c0,0,-1);
  pztopology::TPZTetrahedron::ComputeConstantHDiv(pt,&local_1b8,&local_268);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (divphi);
  uVar2 = pztopology::TPZTetrahedron::NumSides(1);
  local_2a8 = (ulong)uVar2;
  iVar3 = TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::NHCurlShapeF(data);
  lVar8 = (long)iVar3;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar3 != 0) {
    uVar7 = 0xffffffffffffffff;
    if ((ulong)(lVar8 * 3) < 0x2000000000000000) {
      uVar7 = lVar8 * 0x18;
    }
    local_c0.fElem = (double *)operator_new__(uVar7);
  }
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_248.fElem = (double *)0x0;
  local_248.fGiven = (double *)0x0;
  local_248.fSize = 0;
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_248.fPivot.super_TPZVec<int>,0);
  local_248.fPivot.super_TPZVec<int>.fStore = local_248.fPivot.fExtAlloc;
  local_248.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_248.fPivot.super_TPZVec<int>.fNElements = 0;
  local_248.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_248.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_248.fWork.fStore = (double *)0x0;
  local_248.fWork.fNElements = 0;
  local_248.fWork.fNAlloc = 0;
  if (iVar3 != 0) {
    uVar7 = 0xffffffffffffffff;
    if ((ulong)(lVar8 * 3) < 0x2000000000000000) {
      uVar7 = lVar8 * 0x18;
    }
    local_248.fElem = (double *)operator_new__(uVar7);
  }
  memset(local_c0.fElem,0,
         local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  memset(local_248.fElem,0,
         local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_2b0 = 0;
  local_248.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_248.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape(pt,data,&local_c0,&local_248);
  local_270 = 0;
  local_290 = 0;
  do {
    lVar8 = (long)(int)local_2b0;
    lVar11 = 0;
    do {
      if ((local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11) ||
         (local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= local_290)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if (((lVar6 <= lVar11) || ((int)local_2b0 < 0)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar6 * lVar8 + lVar11] =
           *(double *)
            ((long)local_1b8.fElem +
            lVar11 * 8 + local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_270) *
           (double)(data->fSideOrient).super_TPZVec<int>.fStore[local_290];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    if ((((int)local_2b0 < 0) ||
        ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
       ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    divphi->fElem[lVar8] =
         local_268.fStore[local_290] *
         (double)(data->fSideOrient).super_TPZVec<int>.fStore[local_290];
    uVar5 = (int)local_2b0 + 1;
    piVar4 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
    uVar7 = (ulong)uVar5;
    if (0 < piVar4[(int)uVar2]) {
      local_2a8 = (ulong)(int)local_2a8;
      lVar8 = local_2a8 * 8;
      lVar11 = (long)(int)uVar5 * 8;
      iVar3 = 0;
      uVar7 = (long)(int)uVar5;
      do {
        uVar9 = uVar7;
        lVar6 = 0;
        do {
          if (((local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) ||
              ((long)local_2a8 < 0)) ||
             (local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)local_2a8)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar12 <= lVar6) || ((int)local_2b0 < -1)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(undefined8 *)((long)phi->fElem + lVar6 * 8 + lVar12 * lVar11) =
               *(undefined8 *)
                ((long)local_248.fElem +
                lVar6 * 8 + local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_2a8 = local_2a8 + 1;
        iVar3 = iVar3 + 1;
        piVar4 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
        lVar8 = lVar8 + 8;
        lVar11 = lVar11 + 8;
        uVar7 = uVar9 + 1;
        local_2b0 = uVar9;
      } while (iVar3 < piVar4[(int)uVar2]);
    }
    local_2b0 = uVar7;
    local_290 = local_290 + 1;
    local_270 = local_270 + 8;
  } while (local_290 != 4);
  if (0 < piVar4[10]) {
    lVar6 = (long)(int)local_2a8;
    lVar12 = (long)(int)local_2b0;
    lVar8 = lVar6 * 8;
    lVar11 = lVar12 * 8;
    iVar3 = 0;
    do {
      lVar10 = 0;
      do {
        if (((local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar10) || (lVar6 < 0))
           || (local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if (((lVar1 <= lVar10) || (lVar12 < 0)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)((long)phi->fElem + lVar10 * 8 + lVar1 * lVar11) =
             *(undefined8 *)
              ((long)local_248.fElem +
              lVar10 * 8 + local_248.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar6 = lVar6 + 1;
      lVar12 = lVar12 + 1;
      iVar3 = iVar3 + 1;
      lVar8 = lVar8 + 8;
      lVar11 = lVar11 + 8;
    } while (iVar3 < (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[10]);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_248);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  local_268._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_268.fStore != (double *)0x0) {
    operator_delete__(local_268.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_1b8,&PTR_PTR_01887478);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const int nfacets = TSHAPE::NFacets;

    // Compute constant Hdiv functions
    TPZFNMatrix<12,REAL> vecDiv(dim,nfacets);
    TPZVec<REAL> div(nfacets);
    vecDiv.Zero();
    div.Fill(0.);
    // std::cout << "FSide trans ID = " << data.fSideTransformationId << std::endl;
    TSHAPE::ComputeConstantHDiv(pt, vecDiv, div);

    int nshape = data.fPhi.Rows();
    
    if (dim == 2){
        TPZShapeH1<TSHAPE>::Shape(pt,data);    
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);

        int count = 0;
        int countKernel=ncorner;
        //Edge functions
        for (int i = 0; i < nEdges; i++)
        {
            //RT0 Function
            phi(0,count) = vecDiv(0,i) * data.fSideOrient[i];
            phi(1,count) = vecDiv(1,i) * data.fSideOrient[i];
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;

            //Kernel Hdiv
            for (int j = 1; j < data.fHDivConnectOrders[i]; j++)
            {
                phi(0,count) = -data.fDPhi(1,countKernel);
                phi(1,count) =  data.fDPhi(0,countKernel);
                count++;
                countKernel++;
            }
        }
        
        //Internal functions
        for (int i = countKernel; i < nshape; i++){
            phi(0,count) = -data.fDPhi(1,countKernel);
            phi(1,count) =  data.fDPhi(0,countKernel);
            count++;
            countKernel++;
        }
    } else if (dim == 3){
        
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);
        int nshapehcurl = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);
        int nshape = NHDivShapeF(data);
        
        TPZFMatrix<REAL> phiAux(dim,nshapehcurl),curlPhiAux(3,nshapehcurl);
        phiAux.Zero(); curlPhiAux.Zero();

        TPZShapeHCurlNoGrads<TSHAPE>::Shape(pt,data,phiAux,curlPhiAux);
        
        int count = 0;
        int countKernel=nEdges;

        //Face functions
        for (int i = 0; i < nfacets; i++)
        {
            // std::cout << "Side orient - " << i << " " << data.fSideOrient[i] << std::endl;
            //RT0 Function
            for(auto d = 0; d < dim; d++) {
                phi(d,count) = vecDiv(d,i) * data.fSideOrient[i];
            }
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;
        
            //Kernel HDiv functions
            for (int k = 0; k < data.fHDivNumConnectShape[nEdges]; k++){
                for(auto d = 0; d < dim; d++) {
                    phi(d,count) = curlPhiAux(d,countKernel);               
                }
                countKernel++;
                count++;
            }
        }
        //Internal Functions - HDivKernel
        for (int i = 0; i < data.fHDivNumConnectShape[TSHAPE::NSides-TSHAPE::NCornerNodes-1]; i++)
        {
            for (auto d = 0; d < dim; d++)
            {
                phi(d,count) = curlPhiAux(d,countKernel);  
            }
            countKernel++;
            count++;
        }
        // std::cout << "VecDiv = " << vecDiv << std::endl;
        // std::cout << "divphi = " << divphi << std::endl;
        // std::cout << "phi = " << phi << std::endl;
    } else {
        DebugStop();
    }
    

}